

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall
QMenuBarPrivate::popupAction(QMenuBarPrivate *this,QAction *action,bool activateFirst)

{
  QWidget *this_00;
  Data *pDVar1;
  int *piVar2;
  QWidgetPrivate *this_01;
  Representation RVar3;
  QRect QVar4;
  char cVar5;
  int iVar6;
  LayoutDirection LVar7;
  long lVar8;
  QObject *pQVar9;
  Data *pDVar10;
  undefined8 uVar11;
  QWidget *this_02;
  QPoint QVar12;
  QPoint QVar13;
  QPoint QVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long in_FS_OFFSET;
  QRect QVar23;
  undefined1 auVar24 [16];
  QPoint pos;
  QPoint popupPos;
  int local_98;
  QPoint local_68;
  QPoint local_60;
  undefined1 local_58 [24];
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (action != (QAction *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    QAction::menuObject();
    lVar8 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if ((lVar8 != 0) && ((this->field_0x298 & 2) == 0)) {
      this->field_0x2a0 = this->field_0x2a0 | 1;
      cVar5 = QAction::isEnabled();
      if (cVar5 != '\0') {
        QAction::menuObject();
        lVar8 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if ((*(byte *)(*(long *)(lVar8 + 0x20) + 8) & 1) == 0) {
          this->field_0x298 = this->field_0x298 & 0xfd;
          QAction::menuObject();
          pQVar9 = (QObject *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
          if (pQVar9 == (QObject *)0x0) {
            pDVar10 = (Data *)0x0;
          }
          else {
            pDVar10 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar9);
          }
          pDVar1 = (this->activeMenu).wp.d;
          (this->activeMenu).wp.d = pDVar10;
          (this->activeMenu).wp.value = pQVar9;
          if (pDVar1 != (Data *)0x0) {
            LOCK();
            *(int *)pDVar1 = *(int *)pDVar1 + -1;
            UNLOCK();
            if (*(int *)pDVar1 == 0) {
              operator_delete(pDVar1);
            }
          }
          lVar8 = *(long *)((this->activeMenu).wp.value + 8);
          if (this_00 == (QWidget *)0x0) {
            uVar11 = 0;
          }
          else {
            uVar11 = QtSharedPointer::ExternalRefCountData::getAndRef(&this_00->super_QObject);
          }
          piVar2 = *(int **)(lVar8 + 0x2f8);
          *(undefined8 *)(lVar8 + 0x2f8) = uVar11;
          *(QWidget **)(lVar8 + 0x300) = this_00;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              operator_delete(piVar2);
            }
          }
          uVar11 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)action);
          piVar2 = *(int **)(lVar8 + 0x308);
          *(undefined8 *)(lVar8 + 0x308) = uVar11;
          *(QAction **)(lVar8 + 0x310) = action;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              operator_delete(piVar2);
            }
          }
          QVar23 = actionRect(this,action);
          local_40 = (QPoint)((QVar23._0_8_ & 0xffffffff | QVar23._8_8_ & 0xffffffff00000000) +
                             0x100000000);
          this_02 = QWidget::window(this_00);
          QWidget::windowHandle(this_02);
          QVar12 = (QPoint)QWindow::screen();
          iVar22 = QVar23.x2.m_i.m_i - QVar23.x1.m_i;
          iVar6 = iVar22 + 1;
          local_58._0_4_ = ((iVar22 - (iVar6 >> 0x1f)) + 1 >> 1) + local_40.xp.m_i;
          local_58._4_4_ = local_40.yp.m_i;
          QVar13 = QWidget::mapToGlobal(this_00,(QPoint *)local_58);
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QVar14 = (QPoint)QScreen::virtualSiblingAt(QVar12);
          if (QVar14 == (QPoint)0x0) {
            local_58._0_4_ = 0;
            local_58._4_4_ = 0;
          }
          else {
            local_58._0_8_ = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar14);
          }
          local_58._8_8_ = QVar14;
          if ((((QPoint)local_58._0_8_ == (QPoint)0x0) || (QVar14 == (QPoint)0x0)) ||
             (QVar14 = (QPoint)local_58._0_8_, *(int *)(local_58._0_8_ + 4) == 0)) {
            QVar14 = (QPoint)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar12);
            uVar11 = local_58._0_8_;
            local_58._8_8_ = QVar12;
            if ((QPoint)local_58._0_8_ != (QPoint)0x0) {
              LOCK();
              *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_58._0_8_ == 0) {
                local_58._0_8_ = QVar14;
                operator_delete((void *)uVar11);
                QVar14 = (QPoint)local_58._0_8_;
              }
            }
          }
          local_58._0_8_ = QVar14;
          QVar4 = *(QRect *)(lVar8 + 0x410);
          *(undefined8 *)(lVar8 + 0x410) = 0;
          *(undefined8 *)(lVar8 + 0x418) = 0;
          ((QPoint *)(lVar8 + 0x410))->xp = (Representation)local_58._0_4_;
          ((QPoint *)(lVar8 + 0x410))->yp = (Representation)local_58._4_4_;
          ((QPoint *)(lVar8 + 0x418))->xp = (Representation)local_58._8_4_;
          ((QPoint *)(lVar8 + 0x418))->yp = (Representation)local_58._12_4_;
          local_58._0_16_ = (undefined1  [16])QVar4;
          uVar11 = (**(code **)(*(long *)(this->activeMenu).wp.value + 0x70))();
          QVar4 = *(QRect *)(lVar8 + 0x410);
          *(undefined8 *)(lVar8 + 0x410) = 0;
          *(undefined8 *)(lVar8 + 0x418) = 0;
          ((QPoint *)(lVar8 + 0x410))->xp = (Representation)local_58._0_4_;
          ((QPoint *)(lVar8 + 0x410))->yp = (Representation)local_58._4_4_;
          *(undefined8 *)(lVar8 + 0x418) = local_58._8_8_;
          local_60 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          local_58._0_16_ = (undefined1  [16])QVar4;
          QVar12 = QWidget::mapToGlobal(this_00,&local_40);
          local_60.xp = QVar12.xp.m_i;
          local_60.yp = QVar13.yp.m_i;
          auVar24 = QScreen::geometry();
          uVar15 = (ulong)(uint)local_60.xp.m_i;
          if (local_60.xp.m_i <= auVar24._0_4_) {
            uVar15 = auVar24._0_8_ & 0xffffffff;
          }
          iVar22 = auVar24._4_4_;
          uVar17 = (ulong)(uint)local_60.yp.m_i;
          if (local_60.yp.m_i <= iVar22) {
            uVar17 = auVar24._0_8_ >> 0x20;
          }
          local_60.yp.m_i = (int)uVar17;
          iVar18 = (int)((ulong)uVar11 >> 0x20);
          iVar19 = local_60.yp.m_i - iVar18;
          iVar21 = local_60.yp.m_i + iVar18;
          local_60 = (QPoint)(uVar15 | uVar17 << 0x20);
          LVar7 = QWidget::layoutDirection(this_00);
          if ((iVar19 < iVar22) && (auVar24._12_4_ < iVar21)) {
            iVar20 = (int)uVar11;
            if (((LVar7 == RightToLeft) && (local_60.xp.m_i < iVar20)) ||
               ((LVar7 != RightToLeft &&
                (local_98 = auVar24._8_4_, iVar6 + iVar20 + local_60.xp.m_i <= local_98)))) {
              iVar16 = 0;
              if (LVar7 == RightToLeft) {
                iVar16 = iVar20;
              }
              local_60.xp.m_i = local_60.xp.m_i + iVar16 + iVar6;
            }
            else if (LVar7 != RightToLeft) {
              local_60.xp.m_i = local_60.xp.m_i - iVar20;
            }
          }
          else if (LVar7 == RightToLeft) {
            local_60.xp.m_i = local_60.xp.m_i + iVar6;
          }
          if ((this->defaultPopDown == 0) || (iVar22 <= iVar19 && auVar24._12_4_ < iVar21)) {
            local_68.yp.m_i = QVar23.y1.m_i.m_i - iVar18;
            local_68.xp.m_i = 0;
            QVar12 = QWidget::mapToGlobal(this_00,&local_68);
            RVar3.m_i = QVar12.yp.m_i.m_i;
            if (QVar12.yp.m_i.m_i < iVar22) {
              RVar3.m_i = iVar22;
            }
            local_60.yp.m_i = RVar3.m_i;
          }
          this_01 = *(QWidgetPrivate **)((this->activeMenu).wp.value + 8);
          QWidgetPrivate::createTLExtra(this_01);
          QWeakPointer<QObject>::operator=
                    ((QWeakPointer<QObject> *)
                     ((long)(((this_01->extra)._M_t.
                              super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                              super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                            super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xb8
                     ),(QWeakPointer<QObject> *)local_58);
          QMenu::popup((QMenu *)(this->activeMenu).wp.value,&local_60,(QAction *)0x0);
          if (activateFirst) {
            QMenuPrivate::setFirstActionActive(*(QMenuPrivate **)((this->activeMenu).wp.value + 8));
          }
          if ((QPoint)local_58._0_8_ != (QPoint)0x0) {
            LOCK();
            *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
            UNLOCK();
            if ((*(int *)local_58._0_8_ == 0) && ((QPoint)local_58._0_8_ != (QPoint)0x0)) {
              operator_delete((void *)local_58._0_8_);
            }
          }
        }
      }
      local_58._0_16_ = (undefined1  [16])actionRect(this,action);
      QWidget::update(this_00,(QRect *)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::popupAction(QAction *action, bool activateFirst)
{
    Q_Q(QMenuBar);
    if (!action || !action->menu() || closePopupMode)
        return;
    popupState = true;
    if (action->isEnabled() && action->menu()->isEnabled()) {
        closePopupMode = 0;
        activeMenu = action->menu();
        auto *activeMenuPriv = activeMenu->d_func();
        activeMenuPriv->causedPopup.widget = q;
        activeMenuPriv->causedPopup.action = action;

        QRect adjustedActionRect = actionRect(action);
        QPoint popupPos = adjustedActionRect.bottomLeft() + QPoint(0, 1);

        //we put the popup menu on the screen containing the bottom-center of the action rect
        QScreen *menubarScreen = q->window()->windowHandle()->screen();
        QPoint screenTestPos = q->mapToGlobal(popupPos + QPoint(adjustedActionRect.width() / 2, 0));
        QPointer<QScreen> popupScreen = menubarScreen->virtualSiblingAt(screenTestPos);
        if (!popupScreen)
            popupScreen = menubarScreen;
        std::swap(popupScreen, activeMenuPriv->popupScreen);
        const QSize popup_size = activeMenu->sizeHint();
        std::swap(popupScreen, activeMenuPriv->popupScreen);

        // Use screenTestPos.y() for the popup y position. This is the correct global y
        // consistent with the selected screen in cases where the action rect spans
        // multiple screens with different scale factors.
        QPoint pos(q->mapToGlobal(popupPos).x(), screenTestPos.y());

        QRect screenRect = popupScreen->geometry();
        pos = QPoint(qMax(pos.x(), screenRect.x()), qMax(pos.y(), screenRect.y()));
        const bool fitUp = (pos.y() - popup_size.height() >= screenRect.top());
        const bool fitDown = (pos.y() + popup_size.height() <= screenRect.bottom());
        const bool rtl = q->isRightToLeft();
        const int actionWidth = adjustedActionRect.width();

        if (!fitUp && !fitDown) { //we should shift the menu
            bool shouldShiftToRight = !rtl;
            if (rtl && popup_size.width() > pos.x())
                shouldShiftToRight = true;
            else if (actionWidth + popup_size.width() + pos.x() > screenRect.right())
                shouldShiftToRight = false;

            if (shouldShiftToRight) {
                pos.rx() += actionWidth + (rtl ? popup_size.width() : 0);
            } else {
                //shift to left
                if (!rtl)
                    pos.rx() -= popup_size.width();
            }
        } else if (rtl) {
            pos.rx() += actionWidth;
        }

        if (!defaultPopDown || (fitUp && !fitDown))
            pos.setY(qMax(screenRect.y(), q->mapToGlobal(QPoint(0, adjustedActionRect.top()-popup_size.height())).y()));
        QMenuPrivate::get(activeMenu)->topData()->initialScreen = popupScreen;
        activeMenu->popup(pos);
        if (activateFirst)
            activeMenu->d_func()->setFirstActionActive();
    }
    q->update(actionRect(action));
}